

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GmmPageTableMgr *this,GMM_UMD_SYNCCONTEXT *UmdContext)

{
  GmmPageTablePool *pGVar1;
  bool bVar2;
  int iVar3;
  GmmPageTablePool **ppGVar4;
  HANDLE *ppvVar5;
  GMM_RESOURCE_INFO **ppGVar6;
  GmmPageTablePool *local_98;
  GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU local_80;
  GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait;
  undefined1 local_68 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  GMM_CLIENT ClientType;
  uint32_t i;
  GMM_PAGETABLEPool *PrevPool;
  GMM_PAGETABLEPool *Pool;
  GMM_GFX_SIZE_T FreedSize;
  GMM_GFX_SIZE_T PoolSizeToFree;
  GMM_UMD_SYNCCONTEXT *pGStack_18;
  GMM_STATUS Status;
  GMM_UMD_SYNCCONTEXT *UmdContext_local;
  GmmPageTableMgr *this_local;
  
  PoolSizeToFree._4_4_ = GMM_SUCCESS;
  FreedSize = 0;
  Pool = (GMM_PAGETABLEPool *)0x0;
  _ClientType = (GmmPageTablePool *)0x0;
  Dealloc.hCsr._4_4_ = 0;
  pGStack_18 = UmdContext;
  UmdContext_local = (GMM_UMD_SYNCCONTEXT *)this;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    Dealloc.hCsr._0_4_ = GMM_UNDEFINED_CLIENT;
  }
  else {
    Dealloc.hCsr._0_4_ = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    EnterCriticalSection(&this->PoolLock);
  }
  bVar2 = GmmPageTablePool::__IsUnusedTRTTPoolOverLimit(this->pPool,&FreedSize);
  if (bVar2) {
    for (Dealloc.hCsr._4_4_ = 0; Dealloc.hCsr._4_4_ < this->NumNodePoolElements && Pool < FreedSize;
        Dealloc.hCsr._4_4_ = Dealloc.hCsr._4_4_ + 1) {
      if (_ClientType == (GmmPageTablePool *)0x0) {
        local_98 = this->pPool;
      }
      else {
        ppGVar4 = GmmPageTablePool::GetNextPool(_ClientType);
        local_98 = *ppGVar4;
      }
      if (pGStack_18 == (GMM_UMD_SYNCCONTEXT *)0x0) {
        SyncInfoLin::SyncInfoLin((SyncInfoLin *)&Wait);
      }
      else {
        SyncInfoLin::SyncInfoLin
                  ((SyncInfoLin *)&Wait,pGStack_18->BBFenceObj,pGStack_18->BBLastFence);
      }
      bVar2 = GmmPageTablePool::IsPoolInUse(local_98,_Wait);
      if (bVar2) {
        _ClientType = local_98;
      }
      else {
        iVar3 = GmmCheckForNullDevCbPfn
                          ((GMM_CLIENT)Dealloc.hCsr,&this->DeviceCbInt,GMM_DEV_CB_WAIT_FROM_CPU);
        if (iVar3 != 0) {
          memset(&local_80,0,8);
          ppvVar5 = GmmPageTablePool::GetPoolHandle(local_98);
          local_80.bo = *ppvVar5;
          GmmDeviceCallback((GMM_CLIENT)Dealloc.hCsr,&this->DeviceCbInt,&local_80);
        }
        ppvVar5 = GmmPageTablePool::GetPoolHandle(local_98);
        local_68 = (undefined1  [8])*ppvVar5;
        Dealloc.Handle = (HANDLE)GmmPageTablePool::GetGfxAddress(local_98);
        ppGVar6 = GmmPageTablePool::GetGmmResInfo(local_98);
        Dealloc.GfxVA = (GMM_GFX_ADDRESS)*ppGVar6;
        Dealloc.Priv = this->hCsr;
        PoolSizeToFree._4_4_ =
             __GmmDeviceDealloc((GMM_CLIENT)Dealloc.hCsr,&this->DeviceCbInt,
                                (GMM_DEVICE_DEALLOC *)local_68,this->pClientContext);
        if (_ClientType == (GmmPageTablePool *)0x0) {
          ppGVar4 = GmmPageTablePool::GetNextPool(local_98);
          this->pPool = *ppGVar4;
        }
        else {
          ppGVar4 = GmmPageTablePool::GetNextPool(local_98);
          pGVar1 = *ppGVar4;
          ppGVar4 = GmmPageTablePool::GetNextPool(_ClientType);
          *ppGVar4 = pGVar1;
        }
        if (local_98 != (GmmPageTablePool *)0x0) {
          GmmPageTablePool::~GmmPageTablePool(local_98);
          operator_delete(local_98);
        }
        Pool = (GMM_PAGETABLEPool *)&Pool[0x5d17].CPUAddress;
      }
    }
  }
  if (this->AuxTTObj != (AuxTable *)0x0) {
    LeaveCriticalSection(&this->PoolLock);
  }
  return;
}

Assistant:

void GmmLib::GmmPageTableMgr::__ReleaseUnusedPool(GMM_UMD_SYNCCONTEXT *UmdContext)
{
    GMM_STATUS                 Status         = GMM_SUCCESS;
    GMM_GFX_SIZE_T             PoolSizeToFree = {0};
    GMM_GFX_SIZE_T             FreedSize      = {0};
    GmmLib::GMM_PAGETABLEPool *Pool = NULL, *PrevPool = NULL;
    uint32_t                   i = 0;
    GMM_CLIENT                 ClientType;
    GMM_DEVICE_DEALLOC         Dealloc;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    ENTER_CRITICAL_SECTION
    if(pPool->__IsUnusedTRTTPoolOverLimit(&PoolSizeToFree))
    {
        for(i = 0; i < NumNodePoolElements && FreedSize < PoolSizeToFree; i++)
        {
            Pool = (PrevPool) ? PrevPool->GetNextPool() : pPool;

            if(Pool->IsPoolInUse(UmdContext ? SyncInfo(UmdContext->BBFenceObj, UmdContext->BBLastFence) : SyncInfo()))
            {
                PrevPool = Pool;
                continue;
            }

            if(GmmCheckForNullDevCbPfn(ClientType, &DeviceCbInt, GMM_DEV_CB_WAIT_FROM_CPU))
            {
                GMM_DDI_WAITFORSYNCHRONIZATIONOBJECTFROMCPU Wait = {0};
                Wait.bo                                          = Pool->GetPoolHandle();
                GmmDeviceCallback(ClientType, &DeviceCbInt, &Wait);
            }

            Dealloc.Handle = Pool->GetPoolHandle();
            Dealloc.GfxVA  = Pool->GetGfxAddress();
            Dealloc.Priv   = Pool->GetGmmResInfo();
            Dealloc.hCsr   = hCsr;

            Status = __GmmDeviceDealloc(ClientType, &DeviceCbInt, &Dealloc, pClientContext);

            __GMM_ASSERT(GMM_SUCCESS == Status);

            if(PrevPool)
            {
                PrevPool->GetNextPool() = Pool->GetNextPool();
            }
            else
            {
                pPool = Pool->GetNextPool();
            }
            delete Pool;
            FreedSize += PAGETABLE_POOL_SIZE;
        }
    }
    EXIT_CRITICAL_SECTION
}